

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  undefined4 extraout_EAX;
  int iVar1;
  code *pcVar2;
  void *pvVar3;
  char *pcVar4;
  undefined1 auVar5 [16];
  int overflow;
  void *local_1a0;
  uchar local_198 [32];
  uchar local_178 [40];
  secp256k1_scalar local_150;
  secp256k1_ge pt;
  secp256k1_gej res;
  
  overflow = 0;
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/main_impl.h"
            ,0x26,"test condition failed: ctx != NULL");
    abort();
  }
  if (output == (uchar *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "output != NULL";
  }
  else if (point == (secp256k1_pubkey *)0x0) {
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "point != NULL";
  }
  else {
    if (scalar != (uchar *)0x0) {
      pcVar2 = ecdh_hash_function_sha256;
      if (hashfp != (secp256k1_ecdh_hash_function)0x0) {
        pcVar2 = hashfp;
      }
      local_1a0 = data;
      secp256k1_pubkey_load(ctx,&pt,point);
      secp256k1_scalar_set_b32(&local_150,scalar,&overflow);
      auVar5._0_4_ = -(uint)((int)local_150.d[2] == 0 && (int)local_150.d[0] == 0);
      auVar5._4_4_ = -(uint)(local_150.d[2]._4_4_ == 0 && local_150.d[0]._4_4_ == 0);
      auVar5._8_4_ = -(uint)((int)local_150.d[3] == 0 && (int)local_150.d[1] == 0);
      auVar5._12_4_ = -(uint)(local_150.d[3]._4_4_ == 0 && local_150.d[1]._4_4_ == 0);
      iVar1 = movmskps(extraout_EAX,auVar5);
      overflow = (uint)(iVar1 == 0xf) | overflow;
      secp256k1_scalar_cmov(&local_150,&secp256k1_scalar_one,overflow);
      secp256k1_ecmult_const(&res,&pt,&local_150);
      secp256k1_ge_set_gej(&pt,&res);
      secp256k1_fe_normalize(&pt.x);
      secp256k1_fe_normalize(&pt.y);
      secp256k1_fe_get_b32(local_178,&pt.x);
      secp256k1_fe_get_b32(local_198,&pt.y);
      iVar1 = (*pcVar2)(output,local_178,local_198,local_1a0);
      return (uint)(overflow == 0 && iVar1 != 0);
    }
    pvVar3 = (ctx->illegal_callback).data;
    pcVar4 = "scalar != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar4,pvVar3);
  return 0;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    memset(x, 0, 32);
    memset(y, 0, 32);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}